

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O1

u32 __thiscall Counters::count1GetNext(Counters *this,u32 *pos1)

{
  ulong uVar1;
  u32 uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = *(ulong *)(this->count1High + *pos1);
  uVar1 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  uVar4 = 7;
  if (uVar3 != 0) {
    uVar4 = (uint)(uVar1 >> 3) & 0x1fffffff;
  }
  uVar5 = uVar4 + *pos1;
  uVar3 = uVar3 >> ((char)uVar4 * '\b' & 0x3fU) & 0xff;
  *pos1 = uVar5;
  uVar2 = 0;
  if (uVar3 != 0 && uVar5 < 0x200) {
    uVar2 = ((int)uVar3 + -1 + (uint)(this->count1Low[uVar5] == 0)) * 0x100 |
            (uint)this->count1Low[uVar5];
  }
  return uVar2;
}

Assistant:

u32 count1GetNext(u32 &pos1) { // note: we will advance pos1 to the next nonzero counter in register range
      // read 16-bits single symbol counter, split into two 8-bits numbers (count1Low, count1High), while skipping over zeros
	   u64 high = fsst_unaligned_load(&count1High[pos1]);

      u32 zero = high?(__builtin_ctzll(high)>>3):7UL; // number of zero bytes
      high = (high >> (zero << 3)) & 255; // advance to nonzero counter
      if (((pos1 += zero) >= FSST_CODE_MAX) || !high) // SKIP! advance pos2
         return 0; // all zero

      u32 low = count1Low[pos1];
      if (low) high--; // high is incremented early and low late, so decrement high (unless low==0)
      return (u32) ((high << 8) + low);
   }